

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O0

bool test_DiceRoller_roll(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  DiceRoller *this;
  size_type sVar4;
  reference pvVar5;
  int local_48;
  int y;
  int prev;
  vector<int,_std::allocator<int>_> outcome;
  int x;
  DiceRoller *roller;
  bool success;
  
  bVar3 = true;
  this = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this);
  for (outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 1;
      (int)outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage < 4;
      outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)&y,this,
                     (int)outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    iVar1 = (int)outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    bVar2 = false;
    if (bVar3) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&y);
      bVar2 = iVar1 == (int)sVar4;
    }
    bVar3 = bVar2;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&y,0);
    iVar1 = *pvVar5;
    for (local_48 = 0;
        local_48 <
        (int)outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage; local_48 = local_48 + 1) {
      bVar2 = false;
      if (bVar3 != false) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&y,(long)local_48);
        bVar2 = false;
        if (0 < *pvVar5) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&y,(long)local_48);
          bVar2 = *pvVar5 < 7;
        }
      }
      bVar3 = false;
      if (bVar2) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&y,(long)local_48);
        bVar3 = iVar1 <= *pvVar5;
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&y);
  }
  if (this != (DiceRoller *)0x0) {
    DiceRoller::~DiceRoller(this);
    operator_delete(this,0x10);
  }
  return bVar3;
}

Assistant:

bool test_DiceRoller_roll() {
    bool success = true;
    auto* roller = new DiceRoller();

    for (int x = 1; x < 4; x++) {
        std::vector<int> outcome = roller->roll(x);

        success = success && x == (int) outcome.size();
        int prev = outcome[0];
        for (int y = 0; y < x; y++) {
            success = success && outcome[y] > 0 && outcome[y] < 7;
            success = success && prev <= outcome[y];
        }
    }

    delete (roller);

    return success;
}